

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYElement::addProperty(PLYElement *this,PLYProperty *p)

{
  pointer *ppPVar1;
  PLYProperty *this_00;
  PLYProperty *pPVar2;
  pointer pPVar3;
  long lVar4;
  ulong uVar5;
  pointer pPVar6;
  long lVar7;
  ulong uVar8;
  PLYProperty *this_01;
  ulong uVar9;
  
  this_00 = (this->list).
            super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 ==
      (this->list).
      super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pPVar2 = (this->list).
             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)this_00 - (long)pPVar2 == 0x7fffffffffffffc0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar8 = (long)this_00 - (long)pPVar2 >> 6;
    uVar5 = 1;
    if (this_00 != pPVar2) {
      uVar5 = uVar8;
    }
    uVar9 = uVar5 + uVar8;
    if (0x1fffffffffffffe < uVar9) {
      uVar9 = 0x1ffffffffffffff;
    }
    if (CARRY8(uVar5,uVar8)) {
      uVar9 = 0x1ffffffffffffff;
    }
    if (uVar9 == 0) {
      pPVar6 = (pointer)0x0;
    }
    else {
      pPVar6 = (pointer)operator_new(uVar9 << 6);
    }
    anon_unknown_3::PLYProperty::PLYProperty(pPVar6 + uVar8,p);
    pPVar3 = pPVar6;
    if (this_00 != pPVar2) {
      lVar4 = 0;
      do {
        lVar7 = lVar4;
        anon_unknown_3::PLYProperty::PLYProperty
                  ((PLYProperty *)((long)&pPVar6->enc + lVar7),
                   (PLYProperty *)((long)&pPVar2->enc + lVar7));
        lVar4 = lVar7 + 0x40;
        this_01 = pPVar2;
      } while ((PLYProperty *)((long)&pPVar2[1].enc + lVar7) != this_00);
      do {
        anon_unknown_3::PLYProperty::~PLYProperty(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != this_00);
      pPVar3 = (pointer)((long)&pPVar6[1].enc + lVar7);
    }
    if (pPVar2 != (PLYProperty *)0x0) {
      operator_delete(pPVar2);
    }
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_start = pPVar6;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar3 + 1;
    (this->list).
    super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar6 + uVar9;
  }
  else {
    anon_unknown_3::PLYProperty::PLYProperty(this_00,p);
    ppPVar1 = &(this->list).
               super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  return;
}

Assistant:

void addProperty(const PLYProperty &p) { list.push_back(p); }